

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O1

void Abc_ExactStop(char *pFilename)

{
  Ses_TimesEntry_t *pSVar1;
  Ses_TruthEntry_t *pSVar2;
  Ses_TruthEntry_t *__ptr;
  Ses_TimesEntry_t *__ptr_00;
  Ses_Store_t *__ptr_01;
  int in_ECX;
  int in_EDX;
  int in_R8D;
  int in_R9D;
  long lVar3;
  
  if (s_pSesStore == (Ses_Store_t *)0x0) {
    puts("BMS manager has not been started");
    return;
  }
  if (pFilename != (char *)0x0) {
    Ses_StoreWrite(s_pSesStore,pFilename,in_EDX,in_ECX,in_R8D,in_R9D);
  }
  if ((FILE *)s_pSesStore->pDebugEntries != (FILE *)0x0) {
    fclose((FILE *)s_pSesStore->pDebugEntries);
  }
  __ptr_01 = s_pSesStore;
  lVar3 = 0;
  do {
    __ptr = __ptr_01->pEntries[lVar3];
    while (__ptr != (Ses_TruthEntry_t *)0x0) {
      __ptr_00 = __ptr->head;
      while (__ptr_00 != (Ses_TimesEntry_t *)0x0) {
        if (__ptr_00->pNetwork != (char *)0x0) {
          free(__ptr_00->pNetwork);
          __ptr_00->pNetwork = (char *)0x0;
        }
        pSVar1 = __ptr_00->next;
        free(__ptr_00);
        __ptr_00 = pSVar1;
      }
      pSVar2 = __ptr->next;
      free(__ptr);
      __ptr = pSVar2;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x400);
  sat_solver_delete(__ptr_01->pSat);
  if (__ptr_01->szDBName != (char *)0x0) {
    free(__ptr_01->szDBName);
    __ptr_01->szDBName = (char *)0x0;
  }
  if (__ptr_01 == (Ses_Store_t *)0x0) {
    return;
  }
  free(__ptr_01);
  return;
}

Assistant:

void Abc_ExactStop( const char * pFilename )
{
    if ( s_pSesStore )
    {
        if ( pFilename )
            Ses_StoreWrite( s_pSesStore, pFilename, 1, 0, 0, 0 );
        if ( s_pSesStore->pDebugEntries )
            fclose( s_pSesStore->pDebugEntries );
        Ses_StoreClean( s_pSesStore );
    }
    else
        printf( "BMS manager has not been started\n" );
}